

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_math.h
# Opt level: O0

grisu3_diy_fp_t grisu3_diy_fp_multiply(grisu3_diy_fp_t x,grisu3_diy_fp_t y)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  grisu3_diy_fp_t gVar7;
  uint64_t tmp;
  uint64_t bd;
  uint64_t ad;
  uint64_t bc;
  uint64_t ac;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  grisu3_diy_fp_t y_local;
  grisu3_diy_fp_t x_local;
  grisu3_diy_fp_t r;
  
  uVar1 = x.f >> 0x20;
  uVar3 = x.f & 0xffffffff;
  uVar2 = y.f >> 0x20;
  uVar4 = y.f & 0xffffffff;
  uVar5 = uVar3 * uVar2;
  uVar6 = uVar1 * uVar4;
  gVar7.f = uVar1 * uVar2 + (uVar6 >> 0x20) + (uVar5 >> 0x20) +
            ((uVar3 * uVar4 >> 0x20) + (uVar6 & 0xffffffff) + (uVar5 & 0xffffffff) + 0x80000000 >>
            0x20);
  gVar7.e = x.e + 0x40 + y.e;
  gVar7._12_4_ = 0;
  return gVar7;
}

Assistant:

static grisu3_diy_fp_t grisu3_diy_fp_multiply(grisu3_diy_fp_t x, grisu3_diy_fp_t y)
{
    uint64_t a, b, c, d, ac, bc, ad, bd, tmp;
    grisu3_diy_fp_t r;
    a = x.f >> 32; b = x.f & GRISU3_MASK32;
    c = y.f >> 32; d = y.f & GRISU3_MASK32;
    ac = a*c; bc = b*c;
    ad = a*d; bd = b*d;
    tmp = (bd >> 32) + (ad & GRISU3_MASK32) + (bc & GRISU3_MASK32);
    tmp += 1U << 31; /* round */
    r.f = ac + (ad >> 32) + (bc >> 32) + (tmp >> 32);
    r.e = x.e + y.e + 64;
    return r;
}